

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout_p.h
# Opt level: O3

void __thiscall
QToolBarAreaLayoutItem::extendSize(QToolBarAreaLayoutItem *this,Orientation o,int extent)

{
  QSize QVar1;
  QSize QVar2;
  Representation RVar3;
  Representation RVar4;
  
  QVar1 = minimumSize(this);
  QVar2 = (QSize)((ulong)QVar1 >> 0x20);
  if (o == Horizontal) {
    QVar2 = QVar1;
  }
  RVar3.m_i = this->preferredSize;
  if (this->preferredSize < 1) {
    QVar1 = sizeHint(this);
    RVar3.m_i = QVar1.ht.m_i.m_i;
    if (o == Horizontal) {
      RVar3.m_i = QVar1.wd.m_i.m_i;
    }
  }
  RVar4.m_i = RVar3.m_i + extent;
  if (RVar3.m_i + extent <= QVar2.wd.m_i.m_i) {
    RVar4.m_i = QVar2.wd.m_i.m_i;
  }
  QVar2 = sizeHint(this);
  RVar3 = QVar2.ht.m_i;
  if (o == Horizontal) {
    RVar3 = QVar2.wd.m_i;
  }
  if (RVar4.m_i == RVar3.m_i) {
    this->size = RVar4.m_i;
    RVar4.m_i = -1;
  }
  this->preferredSize = RVar4.m_i;
  return;
}

Assistant:

void extendSize(Qt::Orientation o, int extent)
    {
        int newSize = qMax(pick(o, minimumSize()), (preferredSize > 0 ? preferredSize : pick(o, sizeHint())) + extent);
        int sizeh = pick(o, sizeHint());
        if (newSize == sizeh) {
            preferredSize = -1;
            size = sizeh;
        } else {
            preferredSize = newSize;
        }
    }